

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O2

off_t ngx_chain_coalesce_file(ngx_chain_t **in,off_t limit)

{
  ngx_file_t **ppnVar1;
  long lVar2;
  long lVar3;
  ngx_chain_t *pnVar4;
  ulong uVar5;
  long lVar6;
  off_t oVar7;
  ngx_buf_t *pnVar8;
  long lVar9;
  
  pnVar4 = *in;
  pnVar8 = pnVar4->buf;
  ppnVar1 = &pnVar8->file;
  lVar3 = 0;
  oVar7 = pnVar8->file_pos;
  do {
    lVar2 = pnVar8->file_last;
    lVar9 = limit - lVar3;
    if (lVar9 < lVar2 - oVar7) {
      uVar5 = -ngx_pagesize & (lVar9 + oVar7 + ngx_pagesize) - 1;
      lVar6 = uVar5 - oVar7;
      if (lVar2 < (long)uVar5) {
        lVar6 = lVar9;
      }
      lVar3 = lVar3 + lVar6;
LAB_001157cc:
      *in = pnVar4;
      return lVar3;
    }
    lVar3 = lVar3 + (lVar2 - oVar7);
    pnVar4 = pnVar4->next;
    if (pnVar4 == (ngx_chain_t *)0x0) {
      pnVar4 = (ngx_chain_t *)0x0;
      goto LAB_001157cc;
    }
    pnVar8 = pnVar4->buf;
    if (((((pnVar8->field_0x48 & 0x10) == 0) || (limit <= lVar3)) ||
        ((*ppnVar1)->fd != pnVar8->file->fd)) || (oVar7 = lVar2, lVar2 != pnVar8->file_pos))
    goto LAB_001157cc;
  } while( true );
}

Assistant:

off_t
ngx_chain_coalesce_file(ngx_chain_t **in, off_t limit)
{
    off_t         total, size, aligned, fprev;
    ngx_fd_t      fd;
    ngx_chain_t  *cl;

    total = 0;

    cl = *in;
    fd = cl->buf->file->fd;

    do {
        size = cl->buf->file_last - cl->buf->file_pos;

        if (size > limit - total) {
            size = limit - total;

            aligned = (cl->buf->file_pos + size + ngx_pagesize - 1)
                       & ~((off_t) ngx_pagesize - 1);

            if (aligned <= cl->buf->file_last) {
                size = aligned - cl->buf->file_pos;
            }

            total += size;
            break;
        }

        total += size;
        fprev = cl->buf->file_pos + size;
        cl = cl->next;

    } while (cl
             && cl->buf->in_file
             && total < limit
             && fd == cl->buf->file->fd
             && fprev == cl->buf->file_pos);

    *in = cl;

    return total;
}